

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * to_hexstring_abi_cxx11_(BN *bn)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  undefined8 uVar4;
  ostream *poVar5;
  reference puVar6;
  BN *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [32];
  string local_210 [8];
  string group;
  stringstream local_1e8 [8];
  stringstream stream;
  ostream local_1d8 [392];
  undefined1 local_50 [16];
  const_reverse_iterator i;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *raw;
  BN *bn_local;
  string *result;
  
  std::__cxx11::string::string((string *)bn);
  BN::raw((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&i,in_RSI);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::rbegin
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_50 + 8));
  while( true ) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::rend
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             *)(local_50 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             *)local_50);
    if (!bVar1) break;
    std::__cxx11::stringstream::stringstream(local_1e8);
    uVar4 = std::ostream::operator<<(local_1d8,std::hex);
    _Var2 = std::setfill<char>('0');
    poVar5 = std::operator<<(uVar4,_Var2._M_c);
    _Var3 = std::setw(4);
    poVar5 = std::operator<<(poVar5,_Var3);
    puVar6 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                          *)(local_50 + 8));
    std::ostream::operator<<(poVar5,(uint)*puVar6);
    std::__cxx11::stringstream::str();
    std::operator+(local_230,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bn
                  );
    std::__cxx11::string::operator=((string *)bn,(string *)local_230);
    std::__cxx11::string::~string((string *)local_230);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::stringstream::~stringstream(local_1e8);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  *)(local_50 + 8));
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&i);
  return bn;
}

Assistant:

string to_hexstring(const BN& bn) {
    // TODO: make tests
    string result;

    const auto& raw = bn.raw();
    for (auto i = raw.rbegin(); i != raw.rend(); ++i) {
        stringstream stream;
        stream << hex << setfill('0') << setw(bz * 2) << static_cast<uint32_t>(*i);
        string group = stream.str();
        result = result + group;
    }
    return result;
}